

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

hwaddr ppc_hash32_pteg_search
                 (PowerPCCPU_conflict3 *cpu,hwaddr pteg_off,_Bool secondary,target_ulong ptem,
                 ppc_hash_pte32_t *pte)

{
  target_ulong tVar1;
  target_ulong tVar2;
  int local_54;
  int i;
  target_ulong pte1;
  target_ulong pte0;
  hwaddr pte_offset;
  ppc_hash_pte32_t *pte_local;
  target_ulong ptem_local;
  _Bool secondary_local;
  hwaddr pteg_off_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  local_54 = 0;
  pte0 = pteg_off;
  while( true ) {
    if (7 < local_54) {
      return 0xffffffffffffffff;
    }
    tVar1 = ppc_hash32_load_hpte0(cpu,pte0);
    tVar2 = ppc_hash32_load_hpte1(cpu,pte0);
    if ((((tVar1 & 0x80000000) != 0) && (secondary == ((tVar1 & 0x40) != 0))) &&
       (((tVar1 ^ ptem) & 0x7fffffbf) == 0)) break;
    pte0 = pte0 + 8;
    local_54 = local_54 + 1;
  }
  pte->pte0 = (uint32_t)tVar1;
  pte->pte1 = (uint32_t)tVar2;
  return pte0;
}

Assistant:

static hwaddr ppc_hash32_pteg_search(PowerPCCPU *cpu, hwaddr pteg_off,
                                     bool secondary, target_ulong ptem,
                                     ppc_hash_pte32_t *pte)
{
    hwaddr pte_offset = pteg_off;
    target_ulong pte0, pte1;
    int i;

    for (i = 0; i < HPTES_PER_GROUP; i++) {
        pte0 = ppc_hash32_load_hpte0(cpu, pte_offset);
        /*
         * pte0 contains the valid bit and must be read before pte1,
         * otherwise we might see an old pte1 with a new valid bit and
         * thus an inconsistent hpte value
         */
        smp_rmb();
        pte1 = ppc_hash32_load_hpte1(cpu, pte_offset);

        if ((pte0 & HPTE32_V_VALID)
            && (secondary == !!(pte0 & HPTE32_V_SECONDARY))
            && HPTE32_V_COMPARE(pte0, ptem)) {
            pte->pte0 = pte0;
            pte->pte1 = pte1;
            return pte_offset;
        }

        pte_offset += HASH_PTE_SIZE_32;
    }

    return -1;
}